

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

bool __thiscall
HighsMipSolverData::trySolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution,
          int solution_source)

{
  double *pdVar1;
  int iVar2;
  pointer pdVar3;
  HighsLp *pHVar4;
  pointer pdVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pdVar3 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar3) >> 3;
  pHVar4 = this->mipsolver->model_;
  iVar8 = (int)uVar9;
  if (pHVar4->num_col_ == iVar8) {
    if (iVar8 == 0) {
      dVar14 = this->feastol;
      dVar15 = 0.0;
      dVar12 = 0.0;
    }
    else {
      pdVar5 = (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar14 = this->feastol;
      uVar11 = 0;
      dVar15 = 0.0;
      dVar13 = 0.0;
      do {
        dVar16 = pdVar3[uVar11];
        if (dVar16 < pdVar5[uVar11] - dVar14) {
          return false;
        }
        if ((pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] + dVar14 < dVar16) {
          return false;
        }
        if (((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11] == kInteger) &&
           (dVar12 = round(dVar16), dVar14 < ABS(dVar16 - dVar12))) {
          return false;
        }
        dVar16 = dVar16 * (pHVar4->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar11];
        dVar12 = dVar13 + dVar16;
        dVar15 = dVar15 + (dVar13 - (dVar12 - dVar16)) + (dVar16 - (dVar12 - (dVar12 - dVar16)));
        uVar11 = uVar11 + 1;
        dVar13 = dVar12;
      } while ((uVar9 & 0xffffffff) != uVar11);
    }
    piVar6 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if (uVar9 == (uint)pHVar4->num_row_) {
        bVar7 = addIncumbent(this,solution,dVar15 + dVar12,solution_source,true,false);
        return bVar7;
      }
      iVar8 = piVar6[uVar9];
      iVar2 = piVar6[uVar9 + 1];
      dVar13 = 0.0;
      if (iVar2 != iVar8) {
        lVar10 = 0;
        do {
          dVar13 = dVar13 + pdVar3[(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar8 + lVar10]] *
                            (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar8 + lVar10];
          lVar10 = lVar10 + 1;
        } while (iVar2 - iVar8 != (int)lVar10);
      }
    } while ((dVar13 <= (pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9] + dVar14) &&
            (pdVar1 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar9, uVar9 = uVar9 + 1,
            *pdVar1 - dVar14 <= dVar13));
  }
  return false;
}

Assistant:

bool HighsMipSolverData::trySolution(const std::vector<double>& solution,
                                     const int solution_source) {
  if (int(solution.size()) != mipsolver.model_->num_col_) return false;

  HighsCDouble obj = 0;

  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;

    obj += mipsolver.colCost(i) * solution[i];
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return addIncumbent(solution, double(obj), solution_source);
}